

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_58a0d::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemmMx4<2>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  block_q5_0 *pbVar5;
  block_q8_0 *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  bool bVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128i x;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  __m256 Cv [4] [2];
  float local_180 [84];
  
  auVar22 = _DAT_0016a9c0;
  lVar19 = n - n0;
  lVar14 = lVar19 + 3;
  if (-1 < lVar19) {
    lVar14 = lVar19;
  }
  lVar14 = lVar14 >> 2;
  lVar20 = ((m - m0) / 2) * lVar14;
  lVar19 = (lVar20 + -1 + (long)this->nth) / (long)this->nth;
  lVar16 = this->ith * lVar19;
  lVar19 = lVar19 + lVar16;
  if (lVar20 <= lVar19) {
    lVar19 = lVar20;
  }
  if (lVar16 < lVar19) {
    pbVar5 = this->A;
    pbVar6 = this->B;
    auVar23._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar23._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar23._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar23._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar24._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar24._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar24._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar24._24_8_ = 0xf0f0f0f0f0f0f0f0;
    lVar20 = this->k;
    lVar7 = this->ldc;
    lVar8 = this->lda;
    auVar11 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    lVar9 = this->ldb;
    pfVar10 = this->C;
    do {
      local_180[0x30] = 0.0;
      local_180[0x31] = 0.0;
      local_180[0x32] = 0.0;
      local_180[0x33] = 0.0;
      local_180[0x34] = 0.0;
      local_180[0x35] = 0.0;
      local_180[0x36] = 0.0;
      local_180[0x37] = 0.0;
      local_180[0x38] = 0.0;
      local_180[0x39] = 0.0;
      local_180[0x3a] = 0.0;
      local_180[0x3b] = 0.0;
      local_180[0x3c] = 0.0;
      local_180[0x3d] = 0.0;
      local_180[0x3e] = 0.0;
      local_180[0x3f] = 0.0;
      local_180[0x20] = 0.0;
      local_180[0x21] = 0.0;
      local_180[0x22] = 0.0;
      local_180[0x23] = 0.0;
      local_180[0x24] = 0.0;
      local_180[0x25] = 0.0;
      local_180[0x26] = 0.0;
      local_180[0x27] = 0.0;
      local_180[0x28] = 0.0;
      local_180[0x29] = 0.0;
      local_180[0x2a] = 0.0;
      local_180[0x2b] = 0.0;
      local_180[0x2c] = 0.0;
      local_180[0x2d] = 0.0;
      local_180[0x2e] = 0.0;
      local_180[0x2f] = 0.0;
      local_180[0x10] = 0.0;
      local_180[0x11] = 0.0;
      local_180[0x12] = 0.0;
      local_180[0x13] = 0.0;
      local_180[0x14] = 0.0;
      local_180[0x15] = 0.0;
      local_180[0x16] = 0.0;
      local_180[0x17] = 0.0;
      local_180[0x18] = 0.0;
      local_180[0x19] = 0.0;
      local_180[0x1a] = 0.0;
      local_180[0x1b] = 0.0;
      local_180[0x1c] = 0.0;
      local_180[0x1d] = 0.0;
      local_180[0x1e] = 0.0;
      local_180[0x1f] = 0.0;
      local_180[0] = 0.0;
      local_180[1] = 0.0;
      local_180[2] = 0.0;
      local_180[3] = 0.0;
      local_180[4] = 0.0;
      local_180[5] = 0.0;
      local_180[6] = 0.0;
      local_180[7] = 0.0;
      local_180[8] = 0.0;
      local_180[9] = 0.0;
      local_180[10] = 0.0;
      local_180[0xb] = 0.0;
      local_180[0xc] = 0.0;
      local_180[0xd] = 0.0;
      local_180[0xe] = 0.0;
      local_180[0xf] = 0.0;
      lVar15 = m0 + (lVar16 / lVar14) * 2;
      lVar1 = n0 + (lVar16 % lVar14) * 4;
      if (0 < lVar20) {
        auVar27 = vpinsrw_avx(ZEXT216(pbVar6[lVar9 * lVar1].d),(uint)pbVar6[(lVar1 + 1) * lVar9].d,1
                             );
        auVar27 = vpinsrw_avx(auVar27,(uint)pbVar6[(lVar1 + 2) * lVar9].d,2);
        auVar27 = vpinsrw_avx(auVar27,(uint)pbVar6[(lVar1 + 3) * lVar9].d,3);
        auVar27 = vcvtph2ps_f16c(auVar27);
        lVar15 = lVar15 * lVar8;
        uVar4 = *(undefined4 *)(&ggml_table_f32_f16 + (ulong)pbVar5[lVar15].d * 4);
        auVar12._4_4_ = uVar4;
        auVar12._0_4_ = uVar4;
        auVar12._8_4_ = uVar4;
        auVar12._12_4_ = uVar4;
        vmulps_avx512vl(auVar27,auVar12);
        auVar27 = vpsrlw_avx(*(undefined1 (*) [16])pbVar5[lVar15].qs,4);
        auVar28._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * *(undefined1 (*) [16])pbVar5[lVar15].qs
        ;
        auVar28._16_16_ = ZEXT116(1) * auVar27;
        auVar22 = vpermb_avx512vl(auVar22,ZEXT432(*(uint *)pbVar5[lVar15].qh));
        auVar22 = vpor_avx2(auVar22,auVar23);
        auVar22 = vpcmpeqb_avx2(auVar22,auVar11);
        auVar22 = vpternlogq_avx512vl(auVar22,auVar22,auVar22,0xf);
        auVar22 = vpternlogq_avx512vl(auVar22,auVar28,auVar24,0xe4);
        vpsignb_avx2(auVar22,auVar22);
        vpsignb_avx2(*(undefined1 (*) [32])pbVar6[lVar9 * lVar1].qs,auVar22);
        halt_baddata();
      }
      lVar17 = 0;
      do {
        lVar21 = 0;
        bVar13 = true;
        do {
          bVar18 = bVar13;
          pfVar3 = local_180 + lVar17 * 0x10 + lVar21 * 8 + 4;
          pfVar2 = local_180 + lVar17 * 0x10 + lVar21 * 8;
          auVar25._0_4_ = *pfVar3 + *pfVar2;
          auVar25._4_4_ = pfVar3[1] + pfVar2[1];
          auVar25._8_4_ = pfVar3[2] + pfVar2[2];
          auVar25._12_4_ = pfVar3[3] + pfVar2[3];
          auVar27 = vshufpd_avx(auVar25,auVar25,1);
          auVar26._0_4_ = auVar25._0_4_ + auVar27._0_4_;
          auVar26._4_4_ = auVar25._4_4_ + auVar27._4_4_;
          auVar26._8_4_ = auVar25._8_4_ + auVar27._8_4_;
          auVar26._12_4_ = auVar25._12_4_ + auVar27._12_4_;
          auVar27 = vhaddps_avx(auVar26,auVar26);
          pfVar10[lVar15 + (lVar17 + lVar1) * lVar7 + lVar21] = auVar27._0_4_;
          lVar21 = 1;
          bVar13 = false;
        } while (bVar18);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar19);
  }
  return;
}

Assistant:

NOINLINE void gemmMx4(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / 4;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * 4;
            __m256 Cv[4][RM] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t b_delta = ((uint64_t)B[ldb * (jj + 3) + l].d << 48) | ((uint64_t)B[ldb * (jj + 2) + l].d << 32) | ((uint64_t)B[ldb * (jj + 1) + l].d << 16) | (B[ldb * (jj + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 db = _mm_cvtph_ps(_mm_set_epi64x(0, b_delta));
                __m256i bvec0 = load(B + ldb * (jj + 0) + l);
                __m256i bvec1 = load(B + ldb * (jj + 1) + l);
                __m256i bvec2 = load(B + ldb * (jj + 2) + l);
                __m256i bvec3 = load(B + ldb * (jj + 3) + l);
                for (int64_t i = 0; i < RM; ++i) {
                    __m128 da = _mm_set1_ps(unhalf((A[lda * (ii + i) + l].d)));
                    // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                    __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                    dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                    // Computation of dot product and multiplication with appropriate delta value products
                    Cv[0][i] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec0, load(A + lda * (ii + i) + l))),
                                    Cv[0][i]);
                    Cv[1][i] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec1, load(A + lda * (ii + i) + l))),
                                    Cv[1][i]);
                    Cv[2][i] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec2, load(A + lda * (ii + i) + l))),
                                    Cv[2][i]);
                    Cv[3][i] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec3, load(A + lda * (ii + i) + l))),
                                    Cv[3][i]);
                }
            }
            for (int64_t j = 0; j < 4; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }